

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

Addr * __thiscall hwnet::TCPSocket::LocalAddr(TCPSocket *this)

{
  Addr *__addr;
  int iVar1;
  long lVar2;
  Addr *pAVar3;
  Addr *pAVar4;
  byte bVar5;
  Addr local_9c;
  socklen_t local_24 [2];
  socklen_t len;
  
  bVar5 = 0;
  std::mutex::lock(&this->mtx);
  __addr = &this->localAddr;
  if (2 < (this->localAddr).addrType - 1U) {
    local_24[0] = 0x78;
    iVar1 = getsockname(this->fd,(sockaddr *)__addr,local_24);
    if (iVar1 == 0) {
      Addr::MakeBySockAddr(&local_9c,(sockaddr *)__addr,local_24[0]);
      pAVar3 = &local_9c;
      pAVar4 = __addr;
      for (lVar2 = 0x1e; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined4 *)&pAVar4->sockaddr = *(undefined4 *)&pAVar3->sockaddr;
        pAVar3 = (Addr *)((long)pAVar3 + ((ulong)bVar5 * -2 + 1) * 4);
        pAVar4 = (Addr *)((long)pAVar4 + (ulong)bVar5 * -8 + 4);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __addr;
}

Assistant:

const Addr& TCPSocket::LocalAddr() const {
	std::lock_guard<std::mutex> guard(this->mtx);	
	if(!this->localAddr.IsVaild()) {
		socklen_t len = sizeof(this->localAddr);
		if(0 == ::getsockname(this->fd,this->localAddr.Address(),&len)) {
			this->localAddr = Addr::MakeBySockAddr(this->localAddr.Address(),len);
		}		
	}
	return this->localAddr;	
}